

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O2

bool __thiscall QSqlQuery::isNull(QSqlQuery *this,QAnyStringView name)

{
  bool bVar1;
  int field;
  undefined8 uVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  undefined1 local_60 [12];
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_40;
  size_t local_38;
  long local_30;
  
  local_38 = name.m_size;
  local_40 = name.field_0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (*this->d->sqlResult->_vptr_QSqlResult[0x18])((QSqlRecord *)local_60);
  field = QSqlRecord::indexOf((QSqlRecord *)local_60,name);
  QSqlRecord::~QSqlRecord((QSqlRecord *)local_60);
  if (field < 0) {
    lcSqlQuery();
    bVar1 = true;
    if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_60._0_4_ = 2;
      local_60._4_8_ = 0;
      uStack_54 = 0;
      local_4c = 0;
      local_48 = lcSqlQuery::category.name;
      QAnyStringView::toString((QString *)&QStack_78,(QAnyStringView *)&local_40);
      uVar2 = QString::utf16();
      QMessageLogger::warning(local_60,"QSqlQuery::isNull: unknown field name \'%ls\'",uVar2);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
    }
  }
  else {
    bVar1 = isNull(this,field);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQuery::isNull(QAnyStringView name) const
{
    qsizetype index = d->sqlResult->record().indexOf(name);
    if (index > -1)
        return isNull(index);
    qCWarning(lcSqlQuery, "QSqlQuery::isNull: unknown field name '%ls'", qUtf16Printable(name.toString()));
    return true;
}